

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KmerCounter.cc
# Opt level: O2

void __thiscall KmerCounter::write_counts(KmerCounter *this,ofstream *count_file)

{
  std::ostream::write((char *)count_file,(long)&this->k);
  std::ostream::write((char *)count_file,(long)&this->count_mode);
  sdglib::write_string(count_file,&this->name);
  sdglib::write_stringvector(count_file,&this->count_names);
  if (this->k < ' ') {
    sdglib::write_flat_vector<unsigned_long>(count_file,&this->kindex);
  }
  else {
    sdglib::write_flat_vector<unsigned__int128>(count_file,&this->kindex128);
  }
  sdglib::write_flat_vectorvector<unsigned_short>(count_file,&this->counts);
  return;
}

Assistant:

void KmerCounter::write_counts(std::ofstream &count_file) const {
    count_file.write((char *) &k, sizeof(k));
    count_file.write((char *) &count_mode, sizeof(count_mode));
    sdglib::write_string(count_file,name);
    sdglib::write_stringvector(count_file,count_names);
    if (k<=31) sdglib::write_flat_vector(count_file,kindex);
    else sdglib::write_flat_vector(count_file,kindex128);
    sdglib::write_flat_vectorvector(count_file,counts);
}